

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> *
kj::
newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
          (PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
           *__return_storage_ptr__,SourceLocation location)

{
  PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  **ppPVar1;
  Disposer *pDVar2;
  ReducePromises<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> RVar3;
  
  pDVar2 = (Disposer *)operator_new(0x18);
  pDVar2[2]._vptr_Disposer = (_func_int **)0x0;
  pDVar2->_vptr_Disposer = (_func_int **)&PTR_reject_006d9178;
  pDVar2[1]._vptr_Disposer = (_func_int **)&PTR_disposeImpl_006d91b0;
  RVar3.super_PromiseBase.node.ptr = (PromiseBase)operator_new(0x400);
  ppPVar1 = &(((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                *)((long)RVar3.super_PromiseBase.node.ptr + 0x228))->fulfiller).ptr;
  (((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
     *)((long)RVar3.super_PromiseBase.node.ptr + 0x228))->fulfiller).disposer = (Disposer *)0x0;
  (((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
     *)((long)RVar3.super_PromiseBase.node.ptr + 0x210))->fulfiller).ptr =
       (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
        *)&PTR_destroy_006d9228;
  (((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
     *)((long)RVar3.super_PromiseBase.node.ptr + 0x228))->fulfiller).ptr =
       (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
        *)&PTR_reject_006d9278;
  *(undefined1 *)
   &(((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
       *)((long)RVar3.super_PromiseBase.node.ptr + 0x240))->promise).super_PromiseBase.node.ptr = 0;
  *(undefined1 *)
   &(((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
       *)((long)RVar3.super_PromiseBase.node.ptr + 0x3d8))->promise).super_PromiseBase = 0;
  *(undefined1 *)
   &(((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
       *)((long)RVar3.super_PromiseBase.node.ptr + 0x3d8))->fulfiller).ptr = 1;
  (((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
     *)((long)RVar3.super_PromiseBase.node.ptr + 0x3f0))->promise).super_PromiseBase.node.ptr =
       (PromiseNode *)ppPVar1;
  (((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
     *)((long)RVar3.super_PromiseBase.node.ptr + 0x3f0))->fulfiller).disposer = pDVar2;
  pDVar2[2]._vptr_Disposer = (_func_int **)ppPVar1;
  (((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
     *)((long)RVar3.super_PromiseBase.node.ptr + 0x228))->promise).super_PromiseBase =
       RVar3.super_PromiseBase.node.ptr;
  (__return_storage_ptr__->promise).super_PromiseBase.node.ptr =
       (PromiseNode *)
       &(((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
           *)((long)RVar3.super_PromiseBase.node.ptr + 0x210))->fulfiller).ptr;
  (__return_storage_ptr__->fulfiller).disposer = pDVar2 + 1;
  (__return_storage_ptr__->fulfiller).ptr =
       (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
        *)pDVar2;
  return (PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
          *)RVar3.super_PromiseBase.node.ptr;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller(SourceLocation location) {
  auto wrapper = _::WeakFulfiller<T>::make();

  _::OwnPromiseNode intermediate(
      _::allocPromise<_::AdapterPromiseNode<
          _::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  auto promise = _::PromiseNode::to<_::ReducePromises<T>>(
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr), location));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}